

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

size_t __thiscall rcg::Buffer::getSize(Buffer *this,uint32_t part)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  undefined4 in_ESI;
  shared_ptr<const_rcg::GenTLWrapper> *in_RDI;
  size_t offset;
  size_t size;
  undefined8 in_stack_ffffffffffffffc8;
  BUFFER_INFO_CMD cmd;
  void *in_stack_ffffffffffffffd8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  unsigned_long local_8;
  
  if (((ulong)in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    gentl = (shared_ptr<const_rcg::GenTLWrapper> *)
            anon_unknown_5::getBufferValue<unsigned_long>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,cmd);
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    local_8 = anon_unknown_5::getBufferValue<unsigned_long>
                        (gentl,in_stack_ffffffffffffffd8,in_RDI,cmd);
    local_8 = (long)gentl - local_8;
  }
  else {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    local_8 = anon_unknown_5::getBufferPartValue<unsigned_long>
                        (in_RDI,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe0,
                         (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (BUFFER_PART_INFO_CMD)in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

size_t Buffer::getSize(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_DATA_SIZE);
  }
  else
  {
    size_t size=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_SIZE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    return size-offset;
  }
}